

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_location(REF_NODE ref_node,REF_INT node)

{
  REF_GLOB local_28;
  REF_INT node_local;
  REF_NODE ref_node_local;
  
  printf("ref_node %d",(ulong)(uint)node);
  if (((node < 0) || (ref_node->max <= node)) || (ref_node->global[node] < 0)) {
    printf(" invalid\n");
  }
  else {
    if (((node < 0) || (ref_node->max <= node)) || (ref_node->global[node] < 0)) {
      local_28 = -1;
    }
    else {
      local_28 = ref_node->global[node];
    }
    printf(" part %d mine %d glob %ld (%.15e,%.15e,%.15e)\n",ref_node->real[node * 0xf],
           ref_node->real[node * 0xf + 1],ref_node->real[node * 0xf + 2],
           (ulong)(uint)ref_node->part[node],(ulong)(uint)ref_node->ref_mpi->id,local_28);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_node_location(REF_NODE ref_node, REF_INT node) {
  printf("ref_node %d", node);
  if (ref_node_valid(ref_node, node)) {
    printf(" part %d mine %d glob " REF_GLOB_FMT " (%.15e,%.15e,%.15e)\n",
           ref_node_part(ref_node, node), ref_mpi_rank(ref_node_mpi(ref_node)),
           ref_node_global(ref_node, node), ref_node_xyz(ref_node, 0, node),
           ref_node_xyz(ref_node, 1, node), ref_node_xyz(ref_node, 2, node));

  } else {
    printf(" invalid\n");
  }

  return REF_SUCCESS;
}